

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clu_test.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint32_t uVar1;
  PresageArchive *archive_00;
  char *pcVar2;
  int *piVar3;
  char *pcVar4;
  uint8_t (*pauVar5) [3];
  uint local_5c;
  int i;
  uint8_t *color;
  uint32_t offset;
  PresageArchive *archive;
  CLU *pCStack_38;
  LPStatus status;
  CLU *clu;
  PresageArchiveMember *member;
  char *pcStack_20;
  uint32_t rid;
  char *path;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  path = (char *)argv;
  argv_local._0_4_ = argc;
  if (argc < 3) {
    LPWarn("(CLU test)","usage: clu_test <prx> <rid>");
  }
  else {
    pcStack_20 = argv[1];
    member._4_4_ = atoi(argv[2]);
    clu = (CLU *)0x0;
    pCStack_38 = (CLU *)0x0;
    archive_00 = PresageArchive_NewFromFiles
                           (pcStack_20,(char *)0x0,(LPStatus *)((long)&archive + 4));
    pcVar4 = pcStack_20;
    if (archive_00 == (PresageArchive *)0x0) {
      pcVar2 = LPStatusString(archive._4_4_);
      LPWarn("(CLU test)","couldn\'t read %s: %s",pcVar4,pcVar2);
      if (archive._4_4_ == LUNAPURPURA_CANTOPENFILE) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        LPWarn("(CLU test)","%s",pcVar4);
      }
    }
    else {
      clu = (CLU *)PresageArchive_MemberWithResourceId(archive_00,"CLU",member._4_4_);
      if ((PresageArchiveMember *)clu == (PresageArchiveMember *)0x0) {
        LPWarn("(CLU test)","couldn\'t find CLU-type PRX member with RID %ld",(ulong)member._4_4_);
      }
      else {
        uVar1 = PresageArchive_AbsoluteOffsetForMember(archive_00,(PresageArchiveMember *)clu);
        fseek((FILE *)((archive_00->archive).prdprs)->header_fp,(ulong)uVar1,0);
        pCStack_38 = CLU_NewFromFile(((archive_00->archive).prdprs)->header_fp,
                                     (LPStatus *)((long)&archive + 4));
        if (pCStack_38 != (CLU *)0x0) {
          for (local_5c = 0; (int)local_5c < 0x100; local_5c = local_5c + 1) {
            pauVar5 = pCStack_38->array + (int)local_5c;
            LPWarn("(CLU test)","%d\t(%d, %d, %d)",(ulong)local_5c,(ulong)(*pauVar5)[0],
                   (ulong)(*pauVar5)[1],(ulong)(*pauVar5)[2]);
          }
          CLU_Free(pCStack_38);
          PresageArchive_Close(archive_00);
          return 0;
        }
        pcVar4 = LPStatusString(archive._4_4_);
        LPWarn("(CLU test)","couldn\'t create CLU: %s",pcVar4);
      }
    }
    CLU_Free(pCStack_38);
    PresageArchive_Close(archive_00);
  }
  return 1;
}

Assistant:

int
main(int argc, char *argv[])
{
	if (argc < 3) {
		LPWarn(MSGPREFIX, "usage: clu_test <prx> <rid>");
		return EXIT_FAILURE;
	}

	char *path = argv[1];
	uint32_t rid = (uint32_t)atoi(argv[2]);

	PresageArchiveMember *member = NULL;
	CLU *clu = NULL;

	LPStatus status;
	/* XXX PRX only for now */
	PresageArchive *archive = PresageArchive_NewFromFiles(path, NULL, &status);

	if (!archive) {
		LPWarn(MSGPREFIX, "couldn't read %s: %s", path, LPStatusString(status));
		if (status == LUNAPURPURA_CANTOPENFILE) {
			LPWarn(MSGPREFIX, "%s", strerror(errno));
		}
		goto fail;
	}

	member = PresageArchive_MemberWithResourceId(archive, "CLU", rid);

	if (!member) {
		LPWarn(MSGPREFIX, "couldn't find CLU-type PRX member with RID %ld", rid);
		goto fail;
	}

	uint32_t offset = PresageArchive_AbsoluteOffsetForMember(archive, member);
	fseek(archive->archive.prx->fp, (long)offset, SEEK_SET);
	clu = CLU_NewFromFile(archive->archive.prx->fp, &status);

	if (!clu) {
		LPWarn(MSGPREFIX, "couldn't create CLU: %s", LPStatusString(status));
		goto fail;
	}

	uint8_t *color = NULL;

	for (int i = 0; i < CLU_NELEMENTS; i++) {
		color = clu->array[i];
		LPWarn(MSGPREFIX, "%d\t(%d, %d, %d)", i, color[0], color[1], color[2]);
	}

	CLU_Free(clu);
	PresageArchive_Close(archive);
	return EXIT_SUCCESS;

fail:
	CLU_Free(clu);
	PresageArchive_Close(archive);
	return EXIT_FAILURE;
}